

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,TypeVector *types)

{
  Type *pTVar1;
  Type *pTVar2;
  TypeVector *in_RDX;
  string local_30;
  
  pTVar1 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar1 == pTVar2) {
    WriteData(this,"void",4);
    return;
  }
  if ((long)pTVar2 - (long)pTVar1 == 8) {
    Write(this,*pTVar1);
    return;
  }
  (anonymous_namespace)::CWriter::MangleTypes_abi_cxx11_(&local_30,(CWriter *)types,in_RDX);
  WriteData(this,"struct ",7);
  WriteData(this,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CWriter::Write(const TypeVector& types) {
  if (types.empty()) {
    Write("void");
  } else if (types.size() == 1) {
    Write(types[0]);
  } else {
    Write("struct ", MangleTypes(types));
  }
}